

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O1

void __thiscall AbstractModuleClient::sendTimeRateRequest(AbstractModuleClient *this)

{
  TrodesMsg msg;
  long *local_80 [2];
  long local_70 [2];
  string local_60;
  TrodesMsg local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"s","");
  TrodesMsg::TrodesMsg<char_const*>(&local_40,&local_60,"infoTR");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"info_req","");
  MlmWrap::sendMessage(&this->super_MlmWrap,"Trodes",(char *)local_80[0],&local_40,"",0);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  TrodesMsg::~TrodesMsg(&local_40);
  return;
}

Assistant:

void AbstractModuleClient::sendTimeRateRequest(){
    TrodesMsg msg("s", INFO_TIMERATE);
    sendMsgToTrodes(TRODES_INFO_REQ, msg);
}